

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printVectorList(MCInst *MI,uint OpNum,SStream *O,char *LayoutSuffix,MCRegisterInfo *MRI,
                    arm64_vas vas,arm64_vess vess)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint Reg_00;
  uint uVar4;
  arm64_reg aVar5;
  MCOperand *op;
  MCRegisterClass *pMVar6;
  char *pcVar7;
  MCRegisterClass *FPR128RC;
  uint i;
  uint FirstReg;
  uint NumRegs;
  uint Reg;
  arm64_vas vas_local;
  MCRegisterInfo *MRI_local;
  char *LayoutSuffix_local;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  Reg_00 = MCOperand_getReg(op);
  i = 1;
  SStream_concat0(O,"{");
  pMVar6 = MCRegisterInfo_getRegClass(MRI,0x10);
  _Var3 = MCRegisterClass_contains(pMVar6,Reg_00);
  if (!_Var3) {
    pMVar6 = MCRegisterInfo_getRegClass(MRI,0x15);
    _Var3 = MCRegisterClass_contains(pMVar6,Reg_00);
    if (!_Var3) {
      pMVar6 = MCRegisterInfo_getRegClass(MRI,0x13);
      _Var3 = MCRegisterClass_contains(pMVar6,Reg_00);
      if (!_Var3) {
        pMVar6 = MCRegisterInfo_getRegClass(MRI,0x19);
        _Var3 = MCRegisterClass_contains(pMVar6,Reg_00);
        if (!_Var3) {
          pMVar6 = MCRegisterInfo_getRegClass(MRI,0x14);
          _Var3 = MCRegisterClass_contains(pMVar6,Reg_00);
          if (!_Var3) {
            pMVar6 = MCRegisterInfo_getRegClass(MRI,0x20);
            _Var3 = MCRegisterClass_contains(pMVar6,Reg_00);
            if (!_Var3) goto LAB_001cdcc4;
          }
          i = 4;
          goto LAB_001cdcc4;
        }
      }
      i = 3;
      goto LAB_001cdcc4;
    }
  }
  i = 2;
LAB_001cdcc4:
  FirstReg = MCRegisterInfo_getSubReg(MRI,Reg_00,3);
  if ((FirstReg == 0) &&
     (uVar4 = MCRegisterInfo_getSubReg(MRI,Reg_00,10), FirstReg = Reg_00, uVar4 != 0)) {
    FirstReg = uVar4;
  }
  pMVar6 = MCRegisterInfo_getRegClass(MRI,10);
  _Var3 = MCRegisterClass_contains(pMVar6,FirstReg);
  if (_Var3) {
    pMVar6 = MCRegisterInfo_getRegClass(MRI,0x11);
    FirstReg = MCRegisterInfo_getMatchingSuperReg(MRI,FirstReg,2,pMVar6);
  }
  FPR128RC._4_4_ = 0;
  while (FPR128RC._4_4_ < i) {
    pcVar7 = getRegisterName(FirstReg,2);
    SStream_concat(O,"%s%s",pcVar7,LayoutSuffix);
    if (FPR128RC._4_4_ + 1 != i) {
      SStream_concat0(O,", ");
    }
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      aVar5 = AArch64_map_vregister(FirstReg);
      *(arm64_reg *)
       (MI->flat_insn->detail->groups +
       (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = aVar5;
      *(arm64_vas *)
       (MI->flat_insn->detail->groups +
       (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x1a) = vas;
      *(arm64_vess *)
       (MI->flat_insn->detail->groups +
       (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x1e) = vess;
      pcVar2 = MI->flat_insn->detail;
      (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
    }
    FPR128RC._4_4_ = FPR128RC._4_4_ + 1;
    FirstReg = getNextVectorRegister(FirstReg,1);
  }
  SStream_concat0(O,"}");
  return;
}

Assistant:

static void printVectorList(MCInst *MI, unsigned OpNum, SStream *O, char *LayoutSuffix, MCRegisterInfo *MRI, arm64_vas vas, arm64_vess vess)
{
#define GETREGCLASS_CONTAIN0(_class, _reg) MCRegisterClass_contains(MCRegisterInfo_getRegClass(MRI, _class), _reg)

	unsigned Reg = MCOperand_getReg(MCInst_getOperand(MI, OpNum));
	unsigned NumRegs = 1, FirstReg, i;

	SStream_concat0(O, "{");

	// Work out how many registers there are in the list (if there is an actual
	// list).
	if (GETREGCLASS_CONTAIN0(AArch64_DDRegClassID , Reg) ||
			GETREGCLASS_CONTAIN0(AArch64_QQRegClassID, Reg))
		NumRegs = 2;
	else if (GETREGCLASS_CONTAIN0(AArch64_DDDRegClassID, Reg) ||
			GETREGCLASS_CONTAIN0(AArch64_QQQRegClassID, Reg))
		NumRegs = 3;
	else if (GETREGCLASS_CONTAIN0(AArch64_DDDDRegClassID, Reg) ||
			GETREGCLASS_CONTAIN0(AArch64_QQQQRegClassID, Reg))
		NumRegs = 4;

	// Now forget about the list and find out what the first register is.
	if ((FirstReg = MCRegisterInfo_getSubReg(MRI, Reg, AArch64_dsub0)))
		Reg = FirstReg;
	else if ((FirstReg = MCRegisterInfo_getSubReg(MRI, Reg, AArch64_qsub0)))
		Reg = FirstReg;

	// If it's a D-reg, we need to promote it to the equivalent Q-reg before
	// printing (otherwise getRegisterName fails).
	if (GETREGCLASS_CONTAIN0(AArch64_FPR64RegClassID, Reg)) {
		MCRegisterClass *FPR128RC = MCRegisterInfo_getRegClass(MRI, AArch64_FPR128RegClassID);
		Reg = MCRegisterInfo_getMatchingSuperReg(MRI, Reg, AArch64_dsub, FPR128RC);
	}

	for (i = 0; i < NumRegs; ++i, Reg = getNextVectorRegister(Reg, 1)) {
		SStream_concat(O, "%s%s", getRegisterName(Reg, AArch64_vreg), LayoutSuffix);
		if (i + 1 != NumRegs)
			SStream_concat0(O, ", ");
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = AArch64_map_vregister(Reg);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].vas = vas;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].vess = vess;
			MI->flat_insn->detail->arm64.op_count++;
		}
	}

	SStream_concat0(O, "}");
}